

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:328:45)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_date_object_cpp:328:45)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v;
  uint *puVar1;
  wchar_t *extraout_RDX;
  double dVar2;
  wstring_view s_00;
  string s;
  gc_heap_ptr_untyped local_20;
  
  v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  if (v == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish) {
    __return_storage_ptr__->type_ = number;
    (__return_storage_ptr__->field_1).n_ = NAN;
  }
  else {
    to_string((mjs *)&local_20,(this->f).h,v);
    puVar1 = (uint *)gc_heap_ptr_untyped::get(&local_20);
    s_00._M_len = puVar1 + 1;
    s_00._M_str = extraout_RDX;
    dVar2 = anon_unknown_37::date_helper::parse((date_helper *)(ulong)*puVar1,s_00);
    __return_storage_ptr__->type_ = number;
    (__return_storage_ptr__->field_1).n_ = dVar2;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }